

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)4>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  ushort *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  int iVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long in_FS_OFFSET;
  short sVar35;
  short sVar37;
  undefined1 auVar36 [16];
  short sVar38;
  short sVar40;
  undefined1 auVar39 [16];
  IntermediateBuffer intermediate;
  IntermediateBuffer local_4048;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar26 = *fy >> 0x10;
  iVar28 = image->y2 + -1;
  iVar31 = iVar28;
  if (iVar26 < iVar28) {
    iVar28 = iVar26;
    iVar31 = iVar26 + 1;
  }
  iVar23 = image->y1;
  if (iVar26 < iVar23) {
    iVar28 = iVar23;
  }
  uVar27 = (uint)*fy >> 8 & 0xff;
  if (iVar26 < iVar23) {
    iVar31 = iVar23;
  }
  puVar5 = image->imageData;
  lVar29 = (long)iVar28 * image->bytesPerLine;
  lVar33 = (long)iVar31 * image->bytesPerLine;
  iVar28 = (int)((ulong)((long)end - (long)b) >> 2);
  uVar30 = 0x100 - uVar27;
  iVar31 = (fdx >> 0x1f & iVar28 * fdx) + *fx >> 0x10;
  uVar24 = (ulong)(uint)-fdx;
  if (0 < fdx) {
    uVar24 = (ulong)(uint)fdx;
  }
  iVar23 = (int)((long)(uVar24 * (long)iVar28 + 0xffff) / 0x10000) + 2;
  iVar28 = image->x2;
  iVar26 = iVar28 - iVar31;
  if (iVar23 < iVar26) {
    iVar26 = iVar23;
  }
  iVar25 = image->x1;
  if (iVar31 < iVar25) {
    uVar3 = *(uint *)(puVar5 + (long)iVar25 * 4 + lVar29);
    uVar4 = *(uint *)(puVar5 + (long)iVar25 * 4 + lVar33);
    lVar34 = 0;
    do {
      local_4048.buffer_rb[lVar34] =
           (uVar4 & 0xff00ff) * uVar27 + (uVar3 & 0xff00ff) * uVar30 >> 8 & 0xff00ff;
      local_4048.buffer_ag[lVar34] =
           (uVar4 >> 8 & 0xff00ff) * uVar27 + (uVar3 >> 8 & 0xff00ff) * uVar30 >> 8 & 0xff00ff;
      iVar6 = (int)lVar34;
      lVar34 = lVar34 + 1;
      if (iVar25 <= iVar6 + iVar31 + 1) break;
    } while (lVar34 < iVar26);
    iVar25 = iVar31 + (int)lVar34;
  }
  else {
    lVar34 = 0;
    iVar25 = iVar31;
  }
  auVar36 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
  auVar39 = pshuflw(ZEXT416(uVar30),ZEXT416(uVar30),0);
  lVar32 = 0;
  for (; lVar34 < iVar26 + -3; lVar34 = lVar34 + 4) {
    puVar1 = (ushort *)(puVar5 + lVar32 * 4 + lVar29 + (long)iVar25 * 4);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    uVar9 = puVar1[2];
    uVar10 = puVar1[3];
    uVar11 = puVar1[4];
    uVar12 = puVar1[5];
    uVar13 = puVar1[6];
    uVar14 = puVar1[7];
    sVar38 = auVar39._0_2_;
    sVar40 = auVar39._2_2_;
    puVar1 = (ushort *)(puVar5 + lVar32 * 4 + lVar33 + (long)iVar25 * 4);
    uVar15 = *puVar1;
    uVar16 = puVar1[1];
    uVar17 = puVar1[2];
    uVar18 = puVar1[3];
    uVar19 = puVar1[4];
    uVar20 = puVar1[5];
    uVar21 = puVar1[6];
    uVar22 = puVar1[7];
    sVar35 = auVar36._0_2_;
    sVar37 = auVar36._2_2_;
    lVar2 = lVar34 * 4;
    *(ushort *)(local_4048.buffer_ag + lVar34) =
         (ushort)((uVar15 >> 8) * sVar35 + (uVar7 >> 8) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_ag + lVar2 + 2) =
         (ushort)((uVar16 >> 8) * sVar37 + (uVar8 >> 8) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_ag + lVar34 + 1) =
         (ushort)((uVar17 >> 8) * sVar35 + (uVar9 >> 8) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_ag + lVar2 + 6) =
         (ushort)((uVar18 >> 8) * sVar37 + (uVar10 >> 8) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_ag + lVar34 + 2) =
         (ushort)((uVar19 >> 8) * sVar35 + (uVar11 >> 8) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_ag + lVar2 + 10) =
         (ushort)((uVar20 >> 8) * sVar37 + (uVar12 >> 8) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_ag + lVar34 + 3) =
         (ushort)((uVar21 >> 8) * sVar35 + (uVar13 >> 8) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_ag + lVar2 + 0xe) =
         (ushort)((uVar22 >> 8) * sVar37 + (uVar14 >> 8) * sVar40) >> 8;
    lVar2 = lVar34 * 4;
    *(ushort *)(local_4048.buffer_rb + lVar34) =
         (ushort)((uVar15 & 0xff) * sVar35 + (uVar7 & 0xff) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_rb + lVar2 + 2) =
         (ushort)((uVar16 & 0xff) * sVar37 + (uVar8 & 0xff) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_rb + lVar34 + 1) =
         (ushort)((uVar17 & 0xff) * sVar35 + (uVar9 & 0xff) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_rb + lVar2 + 6) =
         (ushort)((uVar18 & 0xff) * sVar37 + (uVar10 & 0xff) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_rb + lVar34 + 2) =
         (ushort)((uVar19 & 0xff) * sVar35 + (uVar11 & 0xff) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_rb + lVar2 + 10) =
         (ushort)((uVar20 & 0xff) * sVar37 + (uVar12 & 0xff) * sVar40) >> 8;
    *(ushort *)(local_4048.buffer_rb + lVar34 + 3) =
         (ushort)((uVar21 & 0xff) * sVar35 + (uVar13 & 0xff) * sVar38) >> 8;
    *(ushort *)((long)local_4048.buffer_rb + lVar2 + 0xe) =
         (ushort)((uVar22 & 0xff) * sVar37 + (uVar14 & 0xff) * sVar40) >> 8;
    lVar32 = lVar32 + 4;
  }
  iVar25 = iVar25 + (int)lVar32;
  iVar28 = iVar28 + -1;
  for (; lVar34 < iVar23; lVar34 = lVar34 + 1) {
    if (iVar28 <= iVar25) {
      iVar25 = iVar28;
    }
    uVar3 = *(uint *)(puVar5 + (long)iVar25 * 4 + lVar29);
    uVar4 = *(uint *)(puVar5 + (long)iVar25 * 4 + lVar33);
    local_4048.buffer_rb[lVar34] =
         (uVar4 & 0xff00ff) * uVar27 + (uVar3 & 0xff00ff) * uVar30 >> 8 & 0xff00ff;
    local_4048.buffer_ag[lVar34] =
         (uVar4 >> 8 & 0xff00ff) * uVar27 + (uVar3 >> 8 & 0xff00ff) * uVar30 >> 8 & 0xff00ff;
    iVar25 = iVar25 + 1;
  }
  intermediate_adder(b,end,&local_4048,iVar31,fx,fdx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                             int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    // count is the size used in the intermediate.buffer.
    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    // length is supposed to be <= BufferSize either because data->m11 < 1 or
    // data->m11 < 2, and any larger buffers split
    Q_ASSERT(count <= BufferSize + 2);
    int f = 0;
    int lim = count;
    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0) x += image.width;
    } else {
        lim = qMin(count, image.x2 - x);
        if (x < image.x1) {
            Q_ASSERT(x < image.x2);
            uint t = s1[image.x1];
            uint b = s2[image.x1];
            quint32 rb = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            quint32 ag = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            do {
                intermediate.buffer_rb[f] = rb;
                intermediate.buffer_ag[f] = ag;
                f++;
                x++;
            } while (x < image.x1 && f < lim);
        }
    }

    if (blendType != BlendTransformedBilinearTiled) {
#if defined(__SSE2__)
        const __m128i disty_ = _mm_set1_epi16(disty);
        const __m128i idisty_ = _mm_set1_epi16(idisty);
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = _mm_loadu_si128((const __m128i*)((const uint *)(s1)+x));
            __m128i topAG = _mm_srli_epi16(top, 8);
            __m128i topRB = _mm_and_si128(top, colorMask);
            // Multiplies each color component by idisty
            topAG = _mm_mullo_epi16 (topAG, idisty_);
            topRB = _mm_mullo_epi16 (topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = _mm_loadu_si128((const __m128i*)((const uint *)(s2)+x));
            __m128i bottomAG = _mm_srli_epi16(bottom, 8);
            __m128i bottomRB = _mm_and_si128(bottom, colorMask);
            bottomAG = _mm_mullo_epi16 (bottomAG, disty_);
            bottomRB = _mm_mullo_epi16 (bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG =_mm_add_epi16(topAG, bottomAG);
            rAG = _mm_srli_epi16(rAG, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_ag[f]), rAG);
            __m128i rRB =_mm_add_epi16(topRB, bottomRB);
            rRB = _mm_srli_epi16(rRB, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__ARM_NEON__)
        const int16x8_t disty_ = vdupq_n_s16(disty);
        const int16x8_t idisty_ = vdupq_n_s16(idisty);
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            int16x8_t top = vld1q_s16((int16_t*)((const uint *)(s1)+x));
            int16x8_t topAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(top), 8));
            int16x8_t topRB = vandq_s16(top, colorMask);
            // Multiplies each color component by idisty
            topAG = vmulq_s16(topAG, idisty_);
            topRB = vmulq_s16(topRB, idisty_);

            // Same for the s2 vector
            int16x8_t bottom = vld1q_s16((int16_t*)((const uint *)(s2)+x));
            int16x8_t bottomAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(bottom), 8));
            int16x8_t bottomRB = vandq_s16(bottom, colorMask);
            bottomAG = vmulq_s16(bottomAG, disty_);
            bottomRB = vmulq_s16(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            int16x8_t rAG = vaddq_s16(topAG, bottomAG);
            rAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rAG), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_ag[f]), rAG);
            int16x8_t rRB = vaddq_s16(topRB, bottomRB);
            rRB = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rRB), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__loongarch_sx)
        const __m128i disty_ = __lsx_vreplgr2vr_h(disty);
        const __m128i idisty_ = __lsx_vreplgr2vr_h(idisty);
        const __m128i colorMask = __lsx_vreplgr2vr_w(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = __lsx_vld((const __m128i*)((const uint *)(s1)+x), 0);
            __m128i topAG = __lsx_vsrli_h(top, 8);
            __m128i topRB = __lsx_vand_v(top, colorMask);
            // Multiplies each color component by idisty
            topAG = __lsx_vmul_h(topAG, idisty_);
            topRB = __lsx_vmul_h(topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = __lsx_vld((const __m128i*)((const uint *)(s2)+x), 0);
            __m128i bottomAG = __lsx_vsrli_h(bottom, 8);
            __m128i bottomRB = __lsx_vand_v(bottom, colorMask);
            bottomAG = __lsx_vmul_h(bottomAG, disty_);
            bottomRB = __lsx_vmul_h(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG = __lsx_vadd_h(topAG, bottomAG);
            rAG = __lsx_vsrli_h(rAG, 8);
            __lsx_vst(rAG, (__m128i*)(&intermediate.buffer_ag[f]), 0);
            __m128i rRB = __lsx_vadd_h(topRB, bottomRB);
            rRB = __lsx_vsrli_h(rRB, 8);
            __lsx_vst(rRB, (__m128i*)(&intermediate.buffer_rb[f]), 0);
        }
#endif
    }
    for (; f < count; f++) { // Same as above but without simd
        if (blendType == BlendTransformedBilinearTiled) {
            if (x >= image.width) x -= image.width;
        } else {
            x = qMin(x, image.x2 - 1);
        }

        uint t = s1[x];
        uint b = s2[x];

        intermediate.buffer_rb[f] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
        intermediate.buffer_ag[f] = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        x++;
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}